

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

st_neverbleed_thread_data_t * get_thread_data(neverbleed_t *nb)

{
  __pid_t _Var1;
  int iVar2;
  st_neverbleed_thread_data_t *__pointer;
  int *piVar3;
  ssize_t sVar4;
  char *fmt;
  
  _Var1 = getpid();
  __pointer = (st_neverbleed_thread_data_t *)pthread_getspecific(nb->thread_key);
  if (__pointer == (st_neverbleed_thread_data_t *)0x0) {
    __pointer = (st_neverbleed_thread_data_t *)malloc(8);
    if (__pointer == (st_neverbleed_thread_data_t *)0x0) {
      fmt = "malloc failed";
      goto LAB_00181c81;
    }
  }
  else {
    if (__pointer->self_pid == _Var1) {
      return __pointer;
    }
    close(__pointer->fd);
  }
  __pointer->self_pid = _Var1;
  iVar2 = socket(1,0x80001,0);
  __pointer->fd = iVar2;
  if (iVar2 == -1) {
    fmt = "socket(2) failed";
  }
  else {
    do {
      iVar2 = connect(__pointer->fd,(sockaddr *)&nb->sun_,0x6e);
      if (iVar2 == 0) {
        goto LAB_00181c3c;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    fmt = "failed to connect to privsep daemon";
  }
  goto LAB_00181c81;
  while (piVar3 = __errno_location(), *piVar3 == 4) {
LAB_00181c3c:
    sVar4 = write(__pointer->fd,nb->auth_token,0x20);
    if (sVar4 != -1) {
      if (sVar4 == 0x20) {
        pthread_setspecific(nb->thread_key,__pointer);
        return __pointer;
      }
      break;
    }
  }
  fmt = "failed to send authentication token";
LAB_00181c81:
  dief(fmt);
}

Assistant:

struct st_neverbleed_thread_data_t *get_thread_data(neverbleed_t *nb)
{
    struct st_neverbleed_thread_data_t *thdata;
    pid_t self_pid = getpid();
    ssize_t r;

    if ((thdata = pthread_getspecific(nb->thread_key)) != NULL) {
        if (thdata->self_pid == self_pid)
            return thdata;
        /* we have been forked! */
        close(thdata->fd);
    } else {
        if ((thdata = malloc(sizeof(*thdata))) == NULL)
            dief("malloc failed");
    }

    thdata->self_pid = self_pid;
#ifdef SOCK_CLOEXEC
    if ((thdata->fd = socket(PF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) == -1)
        dief("socket(2) failed");
#else
    if ((thdata->fd = socket(PF_UNIX, SOCK_STREAM, 0)) == -1)
        dief("socket(2) failed");
    set_cloexec(thdata->fd);
#endif
    while (connect(thdata->fd, (void *)&nb->sun_, sizeof(nb->sun_)) != 0)
        if (errno != EINTR)
            dief("failed to connect to privsep daemon");
    while ((r = write(thdata->fd, nb->auth_token, sizeof(nb->auth_token))) == -1 && errno == EINTR)
        ;
    if (r != sizeof(nb->auth_token))
        dief("failed to send authentication token");
    pthread_setspecific(nb->thread_key, thdata);

    return thdata;
}